

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::HighsDomain(HighsDomain *this,HighsMipSolver *mipsolver)

{
  HighsInt HVar1;
  HighsInt HVar2;
  size_type __n;
  Reason RVar3;
  HighsMipSolver *in_RSI;
  size_type in_RDI;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this_00;
  size_type in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  size_type __new_size;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5baa77);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5baa90);
  __x = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x30);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x5baaa9);
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x48);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::vector
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)0x5baac2);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::vector
            ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)0x5baadb);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x5baaf4);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x5bab10);
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x5bab2c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bab48);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bab64);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5bab80);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5bab9c);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5babb8);
  ObjectivePropagation::ObjectivePropagation
            ((ObjectivePropagation *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  *(HighsMipSolver **)(in_RDI + 0x1d8) = in_RSI;
  std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>::
  deque((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_> *)
        0x5bac01);
  std::
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  ::deque((deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
           *)0x5bac1f);
  *(undefined1 *)(in_RDI + 0x280) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bac41);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bac5a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x5bac73);
  HighsHashTable<int,_void>::HighsHashTable
            ((HighsHashTable<int,_void> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  *(undefined1 *)(in_RDI + 0x300) = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5bacae);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5bacc7);
  std::vector<double,_std::allocator<double>_>::operator=(this_00,__x);
  std::vector<double,_std::allocator<double>_>::operator=(this_00,__x);
  HighsMipSolver::numCol(in_RSI);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(value_type_conflict2 *)0x5bad53);
  __n = in_RDI + 0x2a8;
  HVar1 = HighsMipSolver::numCol(in_RSI);
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(value_type_conflict2 *)0x5bad9f);
  __new_size = in_RDI;
  HVar2 = HighsMipSolver::numCol(in_RSI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(HVar2,in_stack_fffffffffffffef0),__new_size);
  HighsMipSolver::numCol(in_RSI);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)CONCAT44(HVar1,in_stack_ffffffffffffff00),__n);
  RVar3 = Reason::unspecified();
  *(Reason *)(in_RDI + 0x284) = RVar3;
  *(undefined1 *)(in_RDI + 0x280) = 0;
  return;
}

Assistant:

HighsDomain::HighsDomain(HighsMipSolver& mipsolver) : mipsolver(&mipsolver) {
  col_lower_ = mipsolver.model_->col_lower_;
  col_upper_ = mipsolver.model_->col_upper_;
  colLowerPos_.assign(mipsolver.numCol(), -1);
  colUpperPos_.assign(mipsolver.numCol(), -1);
  changedcolsflags_.resize(mipsolver.numCol());
  changedcols_.reserve(mipsolver.numCol());
  infeasible_reason = Reason::unspecified();
  infeasible_ = false;
}